

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O1

batch __thiscall
ear::PolarExtentCoreSimd<xsimd::sse2>::weight_from_cos
          (PolarExtentCoreSimd<xsimd::sse2> *this,PolarExtentCoreContext *ctx,batch cos_angle)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  undefined4 in_EAX;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  float fVar15;
  undefined1 auVar14 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar22;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar23;
  float fVar25;
  undefined1 auVar24 [16];
  batch bVar26;
  batch bVar27;
  
  bVar27.super_simd_register<float,_xsimd::sse2>.data._8_8_ =
       cos_angle.super_simd_register<float,_xsimd::sse2>.data._8_8_;
  fVar3 = ctx->cos_start_angle;
  fVar13 = cos_angle.super_simd_register<float,_xsimd::sse2>.data[0];
  fVar15 = cos_angle.super_simd_register<float,_xsimd::sse2>.data[1];
  fVar16 = cos_angle.super_simd_register<float,_xsimd::sse2>.data[0];
  fVar17 = cos_angle.super_simd_register<float,_xsimd::sse2>.data[1];
  uVar5 = -(uint)(fVar13 < fVar3);
  uVar7 = -(uint)(fVar15 < fVar3);
  auVar20._4_4_ = uVar7;
  auVar20._0_4_ = uVar5;
  auVar20._8_4_ = -(uint)(fVar16 < fVar3);
  auVar20._12_4_ = -(uint)(fVar17 < fVar3);
  iVar4 = movmskps(in_EAX,auVar20);
  if (iVar4 == 0) {
    bVar27.super_simd_register<float,_xsimd::sse2>.data[0] = 1.0;
    bVar27.super_simd_register<float,_xsimd::sse2>.data[1] = 1.0;
    return (batch)bVar27.super_simd_register<float,_xsimd::sse2>.data;
  }
  fVar3 = ctx->cos_end_angle;
  auVar14._4_4_ = -(uint)(fVar3 < fVar15);
  auVar14._0_4_ = -(uint)(fVar3 < fVar13);
  auVar14._8_4_ = -(uint)(fVar3 < fVar16);
  auVar14._12_4_ = -(uint)(fVar3 < fVar17);
  iVar4 = movmskps(iVar4,auVar14);
  if (iVar4 != 0) {
    uVar6 = -(uint)(ABS(fVar13) <= 0.5);
    uVar8 = -(uint)(ABS(fVar15) <= 0.5);
    uVar9 = -(uint)(ABS(fVar16) <= 0.5);
    uVar11 = -(uint)(ABS(fVar17) <= 0.5);
    auVar19._0_4_ = ABS(fVar13) * 0.5;
    auVar19._4_4_ = ABS(fVar15) * 0.5;
    auVar19._8_4_ = ABS(fVar16) * 0.5;
    auVar19._12_4_ = ABS(fVar17) * 0.5;
    auVar1._4_4_ = 0.5 - auVar19._4_4_;
    auVar1._0_4_ = 0.5 - auVar19._0_4_;
    auVar1._8_4_ = 0.5 - auVar19._8_4_;
    auVar1._12_4_ = 0.5 - auVar19._12_4_;
    auVar20 = sqrtps(auVar19,auVar1);
    fVar18 = (float)((uint)fVar13 & uVar6 | ~uVar6 & auVar20._0_4_);
    fVar22 = (float)((uint)fVar15 & uVar8 | ~uVar8 & auVar20._4_4_);
    fVar23 = (float)((uint)fVar16 & uVar9 | ~uVar9 & auVar20._8_4_);
    fVar25 = (float)((uint)fVar17 & uVar11 | ~uVar11 & auVar20._12_4_);
    fVar16 = ABS(fVar18);
    fVar17 = ABS(fVar22);
    uVar9 = -(uint)(fVar16 <= 0.5);
    uVar11 = -(uint)(fVar17 <= 0.5);
    uVar10 = -(uint)(ABS(fVar23) <= 0.5);
    uVar12 = -(uint)(ABS(fVar25) <= 0.5);
    auVar21._0_4_ = (uint)(fVar18 * fVar18) & uVar9;
    auVar21._4_4_ = (uint)(fVar22 * fVar22) & uVar11;
    auVar21._8_4_ = (uint)(fVar23 * fVar23) & uVar10;
    auVar21._12_4_ = (uint)(fVar25 * fVar25) & uVar12;
    auVar24._0_4_ = ~uVar9 & (uint)((1.0 - fVar16) * 0.5);
    auVar24._4_4_ = ~uVar11 & (uint)((1.0 - fVar17) * 0.5);
    auVar24._8_4_ = ~uVar10 & (uint)((1.0 - ABS(fVar23)) * 0.5);
    auVar24._12_4_ = ~uVar12 & (uint)((1.0 - ABS(fVar25)) * 0.5);
    auVar24 = auVar24 | auVar21;
    auVar20 = sqrtps(auVar21,auVar24);
    fVar23 = auVar24._0_4_;
    fVar25 = auVar24._4_4_;
    fVar16 = (float)((uint)fVar16 & uVar9 | ~uVar9 & auVar20._0_4_);
    fVar17 = (float)((uint)fVar17 & uVar11 | ~uVar11 & auVar20._4_4_);
    fVar16 = fVar23 * fVar16 *
             ((((fVar23 * 0.0421632 + 0.024181312) * fVar23 + 0.045470025) * fVar23 + 0.074953005) *
              fVar23 + 0.16666752) + fVar16;
    fVar17 = fVar25 * fVar17 *
             ((((fVar25 * 0.0421632 + 0.024181312) * fVar25 + 0.045470025) * fVar25 + 0.074953005) *
              fVar25 + 0.16666752) + fVar17;
    fVar16 = (float)((~uVar9 & (uint)(1.5707964 - (fVar16 + fVar16)) | (uint)fVar16 & uVar9) ^
                    (uint)fVar18 & 0x80000000);
    fVar17 = (float)((~uVar11 & (uint)(1.5707964 - (fVar17 + fVar17)) | (uint)fVar17 & uVar11) ^
                    (uint)fVar22 & 0x80000000);
    fVar16 = (float)(~uVar6 & (uint)(fVar16 + fVar16) | (uint)fVar16 & uVar6);
    fVar17 = (float)(~uVar8 & (uint)(fVar17 + fVar17) | (uint)fVar17 & uVar8);
    fVar16 = (float)(~-(uint)(-0.5 <= fVar13) & (uint)(3.1415927 - fVar16) |
                    (uint)fVar16 & -(uint)(-0.5 <= fVar13));
    fVar17 = (float)(~-(uint)(-0.5 <= fVar15) & (uint)(3.1415927 - fVar17) |
                    (uint)fVar17 & -(uint)(-0.5 <= fVar15));
    bVar26.super_simd_register<float,_xsimd::sse2>.data[2] =
         ctx->c + (float)(~uVar6 & (uint)fVar16 | (uint)(1.5707964 - fVar16) & uVar6) * ctx->m;
    bVar26.super_simd_register<float,_xsimd::sse2>.data[3] =
         ctx->c + (float)(~uVar8 & (uint)fVar17 | (uint)(1.5707964 - fVar17) & uVar8) * ctx->m;
    bVar26.super_simd_register<float,_xsimd::sse2>.data._0_8_ =
         CONCAT44(-(uint)(fVar3 < fVar15) & uVar7 &
                  (uint)bVar26.super_simd_register<float,_xsimd::sse2>.data[3],
                  -(uint)(fVar3 < fVar13) & uVar5 &
                  (uint)bVar26.super_simd_register<float,_xsimd::sse2>.data[2]) |
         CONCAT44(~uVar7,~uVar5) & 0x3f8000003f800000;
    return (batch)bVar26.super_simd_register<float,_xsimd::sse2>.data;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = cos_angle.super_simd_register<float,_xsimd::sse2>.data._0_8_;
  return (simd_register<float,_xsimd::sse2>)(auVar2 << 0x40);
}

Assistant:

batch weight_from_cos(PolarExtentCoreContext &ctx, batch cos_angle) const {
      auto start = cos_angle >= ctx.cos_start_angle;
      auto end = cos_angle <= ctx.cos_end_angle;
      if (xsimd::all(start)) return batch{1.0};
      if (xsimd::all(end)) return batch{0.0};

      auto ramp = ctx.m * xsimd::acos(cos_angle) + ctx.c;
      return xsimd::select(start, batch{1.0},
                           xsimd::select(end, batch{0.0}, ramp));
    }